

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  undefined1 *puVar1;
  size_type *psVar2;
  undefined1 auVar3 [16];
  _Manager_type p_Var4;
  pointer pSVar5;
  pointer pSVar6;
  unsigned_long uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  pointer poVar17;
  long lVar18;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  *pvVar19;
  size_type __n;
  long lVar20;
  pointer __s2;
  unsigned_long uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  KeyValue<supermap::Key<30UL>,_unsigned_long> minItem;
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  local_128;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  *local_108;
  unsigned_long local_100;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  *local_f8;
  size_type local_f0;
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  local_e8;
  undefined1 local_d0 [40];
  bool local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  shared_ptr<supermap::io::FileManager> local_68;
  KeyValue<supermap::Key<30UL>,_unsigned_long> local_58;
  
  local_108 = this;
  local_f8 = newer;
  std::filesystem::__cxx11::path::path((path *)local_d0,dataFileName,auto_format);
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_78 = (_Manager_type)0x0;
  local_88 = (_Any_data)0x0;
  local_70 = registerSupplier->_M_invoker;
  p_Var4 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_88 = (registerSupplier->super__Function_base)._M_functor;
    *(undefined1 (*) [16])&(registerSupplier->super__Function_base)._M_manager =
         (undefined1  [16])0x0;
    local_78 = p_Var4;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ::SingleFileIndexedStorage
            (&local_108->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
             ,(path *)local_d0,&local_68,(InnerRegisterSupplier *)&local_88);
  pvVar19 = local_f8;
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path((path *)local_d0);
  (local_108->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00125f78;
  (local_108->
  super_Findable<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::Key<30UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00125fc0;
  pSVar5 = (pvVar19->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (pvVar19->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar6 - (long)pSVar5 >> 3) * 0x6db6db6db6db6db7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a0,__n,(allocator_type *)local_d0);
  local_a8 = false;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  ::vector(&local_e8,__n,(value_type *)local_d0,(allocator_type *)&local_58);
  local_100 = batchSize;
  if (pSVar6 == pSVar5) {
    lVar20 = 0;
    local_f0 = __n;
  }
  else {
    lVar18 = __n + (__n == 0);
    lVar22 = 0x28;
    lVar23 = 0;
    lVar20 = 0;
    local_f0 = __n;
    do {
      pSVar5 = (pvVar19->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (**(code **)(*(long *)((long)&(pSVar5->
                                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ).
                                             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             .
                                             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ._vptr_OrderedStorage + lVar23) + 8))
                         ((long)&(pSVar5->
                                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ).
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 .
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ._vptr_OrderedStorage + lVar23);
      poVar17 = local_e8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar13 != 0) {
        pSVar5 = (pvVar19->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(*(long *)((long)&(pSVar5->
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      ).
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      ._vptr_OrderedStorage + lVar23) + 0x20))
                  (local_d0,(long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ._vptr_OrderedStorage + lVar23,0);
        pvVar19 = local_f8;
        if (*(char *)((long)&(poVar17->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload + lVar22) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar17->
                   super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                   ._M_payload + lVar22) = 0;
        }
        puVar1 = (undefined1 *)
                 ((long)&(poVar17->
                         super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                         )._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                         ._M_payload + lVar22);
        *(undefined8 *)(puVar1 + -8) = local_d0._32_8_;
        *(undefined8 *)(puVar1 + -0x18) = local_d0._16_8_;
        *(undefined8 *)(puVar1 + -0x10) = local_d0._24_8_;
        *(undefined8 *)(puVar1 + -0x28) = local_d0._0_8_;
        *(undefined8 *)(puVar1 + -0x20) = local_d0._8_8_;
        *puVar1 = 1;
        pSVar5 = (local_f8->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (**(code **)(*(long *)((long)&(pSVar5->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               ._vptr_OrderedStorage + lVar23) + 8))
                           ((long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ._vptr_OrderedStorage + lVar23);
        lVar20 = lVar20 + lVar13;
      }
      lVar23 = lVar23 + 0x38;
      lVar22 = lVar22 + 0x30;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  (*(local_108->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(local_108->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .register_,lVar20);
  uVar21 = local_100;
  local_128.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  local_128.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  local_128.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  std::
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::reserve(&local_128,local_100);
  uVar11 = (int)local_f0 - 1;
  local_f0 = (size_type)uVar11;
  if (-1 < (int)uVar11) {
    uVar16 = 0;
    uVar15 = local_f0;
    bVar10 = false;
    do {
      do {
        uVar14 = uVar16;
        bVar9 = bVar10;
        if ((local_e8.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar15].
             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
             _M_engaged == true) && (uVar14 = uVar15, bVar9 = true, bVar10)) {
          if (local_e8.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].
              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
              _M_engaged == false) {
            std::__throw_bad_optional_access();
          }
          poVar17 = local_e8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar15;
          __s2 = local_e8.
                 super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16;
          iVar12 = memcmp(poVar17,__s2,0x1e);
          uVar21 = local_100;
          bVar9 = bVar10;
          if (-1 < iVar12) {
            auVar3 = *(undefined1 (*) [16])
                      ((long)&(poVar17->
                              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                              )._M_payload.
                              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                              ._M_payload + 0xe);
            auVar25[0] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0]);
            auVar25[1] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[1] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[1]);
            auVar25[2] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[2] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[2]);
            auVar25[3] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[3] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[3]);
            auVar25[4] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[4] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[4]);
            auVar25[5] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[5] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[5]);
            auVar25[6] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[6] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[6]);
            auVar25[7] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[7] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[7]);
            auVar25[8] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[8] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[8]);
            auVar25[9] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[9] ==
                          (poVar17->
                          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                          )._M_payload.
                          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                          ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[9]);
            auVar25[10] = -((__s2->
                            super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                            )._M_payload.
                            super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                            ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[10]
                           == (poVar17->
                              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                              )._M_payload.
                              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                              ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[10]
                           );
            auVar25[0xb] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xb]
                            == (poVar17->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xb]);
            auVar25[0xc] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xc]
                            == (poVar17->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xc]);
            auVar25[0xd] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xd]
                            == (poVar17->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xd]);
            auVar25[0xe] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xe]
                            == (poVar17->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xe]);
            auVar25[0xf] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xf]
                            == (poVar17->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xf]);
            auVar24[0] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xe]
                          == auVar3[0]);
            auVar24[1] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xf]
                          == auVar3[1]);
            auVar24[2] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x10]
                          == auVar3[2]);
            auVar24[3] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x11]
                          == auVar3[3]);
            auVar24[4] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x12]
                          == auVar3[4]);
            auVar24[5] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x13]
                          == auVar3[5]);
            auVar24[6] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x14]
                          == auVar3[6]);
            auVar24[7] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x15]
                          == auVar3[7]);
            auVar24[8] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x16]
                          == auVar3[8]);
            auVar24[9] = -((__s2->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x17]
                          == auVar3[9]);
            auVar24[10] = -((__s2->
                            super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                            )._M_payload.
                            super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                            ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0x18]
                           == auVar3[10]);
            auVar24[0xb] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x19] == auVar3[0xb]);
            auVar24[0xc] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x1a] == auVar3[0xc]);
            auVar24[0xd] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x1b] == auVar3[0xd]);
            auVar24[0xe] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x1c] == auVar3[0xe]);
            auVar24[0xf] = -((__s2->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x1d] == auVar3[0xf]);
            auVar24 = auVar24 & auVar25;
            uVar14 = uVar16;
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
              uVar21 = local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15];
              local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] = uVar21 + 1;
              pSVar5 = (local_f8->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar14 = (**(code **)(*(long *)&pSVar5[uVar15].
                                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                              .
                                              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   + 8))(pSVar5 + uVar15);
              poVar17 = local_e8.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (uVar21 + 1 < uVar14) {
                pSVar5 = (local_f8->
                         super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                (**(code **)(*(long *)&pSVar5[uVar15].
                                       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                       .
                                       super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                       .
                                       super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                            + 0x20))
                          (local_d0,pSVar5 + uVar15,
                           local_a0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar15]);
                poVar17[uVar15].
                super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                ._M_payload._M_value.value = local_d0._32_8_;
                psVar2 = (size_type *)
                         ((long)&poVar17[uVar15].
                                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                                 ._M_payload + 0x10);
                *psVar2 = local_d0._16_8_;
                psVar2[1] = local_d0._24_8_;
                *(undefined8 *)
                 &poVar17[uVar15].
                  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                  ._M_payload = local_d0._0_8_;
                *(undefined8 *)
                 ((long)&poVar17[uVar15].
                         super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                         ._M_payload + 8) = local_d0._8_8_;
                poVar17[uVar15].
                super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                ._M_engaged = true;
                uVar14 = uVar16;
                uVar21 = local_100;
              }
              else {
                uVar14 = uVar16;
                uVar21 = local_100;
                if (local_e8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                    super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                    ._M_engaged == true) {
                  local_e8.
                  super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                  ._M_engaged = false;
                }
              }
            }
          }
        }
        uVar16 = uVar14;
        pvVar19 = local_f8;
        bVar8 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
        bVar10 = bVar9;
      } while (bVar8);
      if (!bVar9) break;
      if (local_e8.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].
          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
          _M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      poVar17 = local_e8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar16;
      local_58.value =
           (poVar17->
           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>)
           ._M_payload.
           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
           _M_payload._M_value.value;
      local_58.key.super_array<unsigned_char,_30UL>._M_elems._0_8_ =
           *(undefined8 *)
            &(poVar17->
             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
             _M_payload;
      local_58.key.super_array<unsigned_char,_30UL>._M_elems._8_8_ =
           *(undefined8 *)
            ((long)&(poVar17->
                    super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                    ._M_payload + 8);
      local_58.key.super_array<unsigned_char,_30UL>._M_elems._16_8_ =
           *(undefined8 *)
            ((long)&(poVar17->
                    super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                    ._M_payload + 0x10);
      local_58._24_8_ =
           *(undefined8 *)
            ((long)&(poVar17->
                    super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                    ._M_payload + 0x18);
      iVar12 = (int)uVar16;
      uVar7 = local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12];
      local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar12] = uVar7 + 1;
      pSVar5 = (local_f8->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (**(code **)(*(long *)&pSVar5[iVar12].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                           + 8))(pSVar5 + iVar12);
      poVar17 = local_e8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar7 + 1 < uVar15) {
        pSVar5 = (pvVar19->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(*(long *)&pSVar5[iVar12].
                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                    + 0x20))
                  (local_d0,pSVar5 + iVar12,
                   local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar12]);
        poVar17[iVar12].
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_payload._M_value.value = local_d0._32_8_;
        psVar2 = (size_type *)
                 ((long)&poVar17[iVar12].
                         super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                         ._M_payload + 0x10);
        *psVar2 = local_d0._16_8_;
        psVar2[1] = local_d0._24_8_;
        *(undefined8 *)
         &poVar17[iVar12].
          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
          _M_payload = local_d0._0_8_;
        *(undefined8 *)
         ((long)&poVar17[iVar12].
                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                 ._M_payload + 8) = local_d0._8_8_;
        poVar17[iVar12].
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_engaged = true;
      }
      else if (local_e8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar12].
               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
               ._M_engaged == true) {
        local_e8.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar12].
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_engaged = false;
      }
      if (local_128.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_128.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
        ::_M_realloc_insert<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>
                  ((vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
                    *)&local_128,
                   (iterator)
                   local_128.
                   super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_58);
      }
      else {
        (local_128.
         super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->value = local_58.value;
        *(undefined8 *)
         (((local_128.
            super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
          _M_elems + 0x10) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._16_8_;
        *(undefined8 *)
         (((local_128.
            super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
          _M_elems + 0x18) = local_58._24_8_;
        *(undefined8 *)
         ((local_128.
           super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
         _M_elems = local_58.key.super_array<unsigned_char,_30UL>._M_elems._0_8_;
        *(undefined8 *)
         (((local_128.
            super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
          _M_elems + 8) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._8_8_;
        local_128.
        super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (uVar21 <= (ulong)(((long)local_128.
                                   super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_128.
                                   super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333)) {
        SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
        ::
        appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,void>
                  ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
                    *)local_108);
        if (local_128.
            super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_128.
            super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_128.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_128.
               super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        std::
        vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
        ::reserve(&local_128,uVar21);
      }
      bVar10 = false;
      uVar16 = 0;
      uVar15 = local_f0;
    } while (-1 < (int)local_f0);
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
  ::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
              *)local_108,
             local_128.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_128.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_128.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_128.
    super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_128.
         super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::reserve(&local_128,uVar21);
  if (local_128.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }